

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_graph.hh
# Opt level: O1

void __thiscall
tchecker::graph::directed::
graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>
::remove_edges(graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>
               *this,intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
                     *n)

{
  edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>
  in_end;
  edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>
  it_1;
  range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>
  in_edges;
  edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>
  out_end;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  edge_1;
  range_t<tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>,_tchecker::graph::directed::edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>
  out_edges;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  local_68;
  edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>
  local_60;
  edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>
  local_58;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  local_50;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  local_48;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  local_40;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  local_38;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  local_30;
  
  edges<tchecker::graph::directed::details::outgoing>
            ((graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>
              *)&local_38,
             (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
              *)this);
  local_48._t = (make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>
                 *)0x0;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  ::reset(&local_48,local_30._t);
  local_58._edge._t =
       (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
        )(make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>
          *)0x0;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  ::reset(&local_58._edge,local_38._t);
  if (local_58._edge._t !=
      (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
       )local_48._t) {
    do {
      local_68._t = (make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>
                     *)0x0;
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
      ::reset(&local_68,
              (make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>
               *)local_58._edge._t);
      edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>
      ::operator++(&local_58);
      remove_edge<tchecker::graph::directed::details::incoming>(this,&local_68);
      remove_edge<tchecker::graph::directed::details::outgoing>(this,&local_68);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(&local_68);
    } while (local_58._edge._t !=
             (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
              )local_48._t);
  }
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_58._edge);
  edges<tchecker::graph::directed::details::incoming>
            ((graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>
              *)&local_58,
             (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
              *)this);
  local_68._t = (make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>
                 *)0x0;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  ::reset(&local_68,local_50._t);
  local_60._edge._t =
       (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
        )(make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>
          *)0x0;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  ::reset(&local_60._edge,
          (make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>
           *)local_58._edge._t);
  if (local_60._edge._t !=
      (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
       )local_68._t) {
    do {
      local_40._t = (make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>
                     *)0x0;
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
      ::reset(&local_40,
              (make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>
               *)local_60._edge._t);
      edge_iterator_t<tchecker::graph::directed::details::incoming,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>
      ::operator++(&local_60);
      remove_edge<tchecker::graph::directed::details::incoming>(this,&local_40);
      remove_edge<tchecker::graph::directed::details::outgoing>(this,&local_40);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(&local_40);
    } while (local_60._edge._t !=
             (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
              )local_68._t);
  }
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_60._edge);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_68);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_50);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_58._edge);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_48);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_30);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::edge_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>
  ::~intrusive_shared_ptr_t(&local_38);
  return;
}

Assistant:

void remove_edges(NODE_PTR const & n)
  {
    auto out_edges = outgoing_edges(n);
    auto out_end = out_edges.end();
    for (auto it = out_edges.begin(); it != out_end;) {
      EDGE_PTR edge = *it;
      ++it;
      remove_edge(edge);
    }

    auto in_edges = incoming_edges(n);
    auto in_end = in_edges.end();
    for (auto it = in_edges.begin(); it != in_end;) {
      EDGE_PTR edge = *it;
      ++it;
      remove_edge(edge);
    }
  }